

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.cc
# Opt level: O1

void __thiscall
draco::Encoder::SetAttributeQuantization(Encoder *this,Type type,int quantization_bits)

{
  Options *this_00;
  Type local_44;
  string local_40;
  
  local_44 = type;
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"quantization_bits","");
  this_00 = DracoOptions<draco::GeometryAttribute::Type>::GetAttributeOptions
                      (&(this->
                        super_EncoderBase<draco::EncoderOptionsBase<draco::GeometryAttribute::Type>_>
                        ).options_.super_DracoOptions<draco::GeometryAttribute::Type>,&local_44);
  Options::SetInt(this_00,&local_40,quantization_bits);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void Encoder::SetAttributeQuantization(GeometryAttribute::Type type,
                                       int quantization_bits) {
  options().SetAttributeInt(type, "quantization_bits", quantization_bits);
}